

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmValue __thiscall
cmLocalGenerator::GetFeature(cmLocalGenerator *this,string *feature,string *config)

{
  bool bVar1;
  ulong uVar2;
  cmStateSnapshot local_d8;
  undefined4 local_bc;
  cmStateDirectory local_b8;
  undefined1 local_90 [8];
  cmStateSnapshot snp;
  undefined1 local_48 [8];
  string featureName;
  string *config_local;
  string *feature_local;
  cmLocalGenerator *this_local;
  cmValue value;
  
  featureName.field_2._8_8_ = config;
  std::__cxx11::string::string((string *)local_48,(string *)feature);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)local_48,"_");
    cmsys::SystemTools::UpperCase
              ((string *)&snp.Position.Position,(string *)featureName.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_48,(string *)&snp.Position.Position);
    std::__cxx11::string::~string((string *)&snp.Position.Position);
  }
  local_90 = (undefined1  [8])(this->super_cmOutputConverter).StateSnapshot.State;
  snp.State = (cmState *)(this->super_cmOutputConverter).StateSnapshot.Position.Tree;
  snp.Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)
       (this->super_cmOutputConverter).StateSnapshot.Position.Position;
  while (bVar1 = cmStateSnapshot::IsValid((cmStateSnapshot *)local_90), bVar1) {
    cmStateSnapshot::GetDirectory(&local_b8,(cmStateSnapshot *)local_90);
    this_local = (cmLocalGenerator *)cmStateDirectory::GetProperty(&local_b8,(string *)local_48);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
    if (bVar1) goto LAB_0068c240;
    cmStateSnapshot::GetBuildsystemDirectoryParent(&local_d8,(cmStateSnapshot *)local_90);
    local_90 = (undefined1  [8])local_d8.State;
    snp.State = (cmState *)local_d8.Position.Tree;
    snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_d8.Position.Position;
  }
  cmValue::cmValue((cmValue *)&this_local,(nullptr_t)0x0);
LAB_0068c240:
  local_bc = 1;
  std::__cxx11::string::~string((string *)local_48);
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmLocalGenerator::GetFeature(const std::string& feature,
                                     const std::string& config)
{
  std::string featureName = feature;
  // TODO: Define accumulation policy for features (prepend, append,
  // replace). Currently we always replace.
  if (!config.empty()) {
    featureName += "_";
    featureName += cmSystemTools::UpperCase(config);
  }
  cmStateSnapshot snp = this->StateSnapshot;
  while (snp.IsValid()) {
    if (cmValue value = snp.GetDirectory().GetProperty(featureName)) {
      return value;
    }
    snp = snp.GetBuildsystemDirectoryParent();
  }
  return nullptr;
}